

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.cc
# Opt level: O0

uint64_t double_conversion::ReadUInt64(Vector<const_char> buffer,int from,int digits_to_read)

{
  char *pcVar1;
  int in_ECX;
  int in_EDX;
  int digit;
  int i;
  uint64_t result;
  int local_24;
  uint64_t local_20;
  Vector<const_char> local_10;
  
  local_20 = 0;
  for (local_24 = in_EDX; local_24 < in_EDX + in_ECX; local_24 = local_24 + 1) {
    pcVar1 = Vector<const_char>::operator[](&local_10,local_24);
    local_20 = local_20 * 10 + (long)(*pcVar1 + -0x30);
  }
  return local_20;
}

Assistant:

static uint64_t ReadUInt64(const Vector<const char> buffer,
                           const int from,
                           const int digits_to_read) {
  uint64_t result = 0;
  for (int i = from; i < from + digits_to_read; ++i) {
    const int digit = buffer[i] - '0';
    DOUBLE_CONVERSION_ASSERT(0 <= digit && digit <= 9);
    result = result * 10 + digit;
  }
  return result;
}